

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int get_command_idx(char *command)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  char *__s2;
  cmd_desc *pcVar4;
  
  bVar1 = flags.debug;
  if ((command != (char *)0x0) && (*command != '\0')) {
    pcVar4 = cmdlist;
    __s2 = "adjust";
    iVar3 = 0;
    do {
      pcVar4 = pcVar4 + 1;
      iVar2 = strcmp(command,__s2);
      if (iVar2 == 0) {
        if (bVar1 != '\0') {
          return iVar3;
        }
        if ((pcVar4[-1].flags & 0x4000) == 0) {
          return iVar3;
        }
      }
      __s2 = pcVar4->name;
      iVar3 = iVar3 + 1;
    } while (__s2 != (char *)0x0);
  }
  return -1;
}

Assistant:

int get_command_idx(const char *command)
{
	int i;
	
	if (!command || !command[0])
	    return -1;
	
	for (i = 0; cmdlist[i].name; i++)
	    if (!strcmp(command, cmdlist[i].name) &&
		(wizard || !(cmdlist[i].flags & CMD_DEBUG)))
		return i;
	
	return -1;
}